

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterThunkEmitter.cpp
# Opt level: O2

BYTE * __thiscall
InterpreterThunkEmitter::GetNextThunk
          (InterpreterThunkEmitter *this,PVOID *ppDynamicInterpreterThunk)

{
  DWORD DVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  BYTE *pBVar5;
  
  if (ppDynamicInterpreterThunk == (PVOID *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/InterpreterThunkEmitter.cpp"
                       ,0x124,"(ppDynamicInterpreterThunk)","ppDynamicInterpreterThunk");
    if (!bVar3) goto LAB_005187b4;
    *puVar4 = 0;
  }
  if (*ppDynamicInterpreterThunk != (PVOID)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/InterpreterThunkEmitter.cpp"
                       ,0x125,"(*ppDynamicInterpreterThunk == nullptr)",
                       "*ppDynamicInterpreterThunk == nullptr");
    if (!bVar3) goto LAB_005187b4;
    *puVar4 = 0;
  }
  if (this->thunkCount == 0) {
    if ((SListBase<ThunkBlock,_Memory::ArenaAllocator,_RealCount> *)
        (this->freeListedThunkBlocks).super_SListNodeBase<Memory::ArenaAllocator>.next !=
        &this->freeListedThunkBlocks) {
      pBVar5 = AllocateFromFreeList(this,ppDynamicInterpreterThunk);
      return pBVar5;
    }
    bVar3 = NewThunkBlock(this);
    if (!bVar3) {
      if (this->isAsmInterpreterThunk != false) {
        return (BYTE *)Js::InterpreterStackFrame::StaticInterpreterAsmThunk;
      }
      return (BYTE *)Js::InterpreterStackFrame::StaticInterpreterThunk;
    }
  }
  pBVar5 = this->thunkBuffer;
  if (pBVar5 == (BYTE *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/InterpreterThunkEmitter.cpp"
                       ,0x138,"(this->thunkBuffer != nullptr)","this->thunkBuffer != nullptr");
    if (!bVar3) goto LAB_005187b4;
    *puVar4 = 0;
    pBVar5 = this->thunkBuffer;
  }
  DVar1 = this->thunkCount;
  this->thunkCount = DVar1 - 1;
  *ppDynamicInterpreterThunk = pBVar5 + (ulong)(DVar1 * 8 - 8) + 0x48;
  if (((ulong)(pBVar5 + (ulong)(DVar1 * 8 - 8) + 0x48) & 7) != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/InterpreterThunkEmitter.cpp"
                       ,0x141,"(((uintptr_t)(*ppDynamicInterpreterThunk) & 0x7) == 0)",
                       "Not 8 byte aligned?");
    if (!bVar3) {
LAB_005187b4:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar4 = 0;
  }
  return pBVar5;
}

Assistant:

BYTE* InterpreterThunkEmitter::GetNextThunk(PVOID* ppDynamicInterpreterThunk)
{
    Assert(ppDynamicInterpreterThunk);
    Assert(*ppDynamicInterpreterThunk == nullptr);

    if(thunkCount == 0)
    {
        if(!this->freeListedThunkBlocks.Empty())
        {
            return AllocateFromFreeList(ppDynamicInterpreterThunk);
        }
        if (!NewThunkBlock())
        {
#ifdef ASMJS_PLAT
            return this->isAsmInterpreterThunk ? (BYTE*)&Js::InterpreterStackFrame::StaticInterpreterAsmThunk : (BYTE*)&Js::InterpreterStackFrame::StaticInterpreterThunk;
#else
            Assert(!this->isAsmInterpreterThunk);
            return (BYTE*)&Js::InterpreterStackFrame::StaticInterpreterThunk;
#endif
        }
    }

    Assert(this->thunkBuffer != nullptr);
    BYTE* thunk = this->thunkBuffer;
#if _M_ARM
    thunk = (BYTE*)((DWORD)thunk | 0x01);
#endif
    *ppDynamicInterpreterThunk = thunk + HeaderSize + ((--thunkCount) * ThunkSize);
#if _M_ARM
    AssertMsg(((uintptr_t)(*ppDynamicInterpreterThunk) & 0x6) == 0, "Not 8 byte aligned?");
#else
    AssertMsg(((uintptr_t)(*ppDynamicInterpreterThunk) & 0x7) == 0, "Not 8 byte aligned?");
#endif
    return thunk;
}